

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_bench_sqlite3.cc
# Opt level: O2

void __thiscall leveldb::Benchmark::FinishedSingleOp(Benchmark *this)

{
  uint uVar1;
  int iVar2;
  Env *pEVar3;
  undefined4 extraout_var;
  uint uVar4;
  double value;
  undefined1 auVar5 [16];
  double dVar6;
  
  if (FLAGS_histogram) {
    pEVar3 = Env::Default();
    iVar2 = (*pEVar3->_vptr_Env[0x15])(pEVar3);
    auVar5._4_4_ = extraout_var;
    auVar5._0_4_ = iVar2;
    auVar5._8_4_ = extraout_var;
    auVar5._12_4_ = 0x45300000;
    dVar6 = ((auVar5._8_8_ - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,iVar2) - 4503599627370496.0)) * 1e-06;
    value = (dVar6 - this->last_op_finish_) * 1000000.0;
    Histogram::Add(&this->hist_,value);
    if (20000.0 < value) {
      fprintf(_stderr,"long op: %.1f micros%30s\r","");
      fflush(_stderr);
    }
    this->last_op_finish_ = dVar6;
  }
  uVar1 = this->next_report_;
  uVar4 = this->done_ + 1;
  this->done_ = uVar4;
  if ((int)uVar4 < (int)uVar1) {
    return;
  }
  if ((int)uVar1 < 1000) {
    iVar2 = 100;
  }
  else {
    iVar2 = 500;
    if ((((4999 < uVar1) && (iVar2 = 1000, 9999 < uVar1)) && (iVar2 = 5000, 49999 < uVar1)) &&
       ((iVar2 = 10000, 99999 < uVar1 && (iVar2 = 100000, uVar1 < 500000)))) {
      iVar2 = 50000;
    }
  }
  this->next_report_ = uVar1 + iVar2;
  fprintf(_stderr,"... finished %d ops%30s\r",(ulong)uVar4,"");
  fflush(_stderr);
  return;
}

Assistant:

void FinishedSingleOp() {
    if (FLAGS_histogram) {
      double now = Env::Default()->NowMicros() * 1e-6;
      double micros = (now - last_op_finish_) * 1e6;
      hist_.Add(micros);
      if (micros > 20000) {
        std::fprintf(stderr, "long op: %.1f micros%30s\r", micros, "");
        std::fflush(stderr);
      }
      last_op_finish_ = now;
    }

    done_++;
    if (done_ >= next_report_) {
      if (next_report_ < 1000)
        next_report_ += 100;
      else if (next_report_ < 5000)
        next_report_ += 500;
      else if (next_report_ < 10000)
        next_report_ += 1000;
      else if (next_report_ < 50000)
        next_report_ += 5000;
      else if (next_report_ < 100000)
        next_report_ += 10000;
      else if (next_report_ < 500000)
        next_report_ += 50000;
      else
        next_report_ += 100000;
      std::fprintf(stderr, "... finished %d ops%30s\r", done_, "");
      std::fflush(stderr);
    }
  }